

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::
initialize<tinyusdz::Animatable<tinyusdz::Extent>>
          (optional<tinyusdz::Animatable<tinyusdz::Extent>> *this,
          Animatable<tinyusdz::Extent> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::Extent>>)0x1) {
    tinyusdz::Animatable<tinyusdz::Extent>::Animatable
              ((Animatable<tinyusdz::Extent> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::Extent>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::Extent>, V = tinyusdz::Animatable<tinyusdz::Extent>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }